

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O1

void __thiscall
duckdb::BatchCollectionChunkScanState::BatchCollectionChunkScanState
          (BatchCollectionChunkScanState *this,BatchedDataCollection *collection,
          BatchedChunkIteratorRange *range,ClientContext *context)

{
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *this_00;
  int iVar1;
  DataChunk *this_01;
  BufferManager *pBVar2;
  undefined4 extraout_var;
  pointer this_02;
  vector<duckdb::LogicalType,_true> *types;
  
  ChunkScanState::ChunkScanState(&this->super_ChunkScanState);
  (this->super_ChunkScanState)._vptr_ChunkScanState =
       (_func_int **)&PTR__BatchCollectionChunkScanState_019ca8d8;
  this->collection = collection;
  (this->state).range.begin._M_node = (_Base_ptr)0x0;
  (this->state).range.end._M_node = (_Base_ptr)0x0;
  (this->state).scan_state.current_chunk_state.handles._M_h._M_buckets =
       &(this->state).scan_state.current_chunk_state.handles._M_h._M_single_bucket;
  (this->state).scan_state.current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->state).scan_state.current_chunk_state.handles._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->state).scan_state.current_chunk_state.handles._M_h._M_element_count = 0;
  (this->state).scan_state.current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor =
       1.0;
  (this->state).scan_state.current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->state).scan_state.current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->state).scan_state.current_chunk_state.properties = INVALID;
  (this->state).scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->state).scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->state).scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BatchedDataCollection::InitializeScan(collection,&this->state,range);
  this_01 = (DataChunk *)operator_new(0x40);
  DataChunk::DataChunk(this_01);
  this_00 = &(this->super_ChunkScanState).current_chunk;
  ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
            ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)this_00,
             this_01);
  pBVar2 = BufferManager::GetBufferManager(context);
  iVar1 = (*pBVar2->_vptr_BufferManager[0x14])(pBVar2);
  this_02 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                      (this_00);
  types = BatchedDataCollection::Types(collection);
  DataChunk::Initialize(this_02,(Allocator *)CONCAT44(extraout_var,iVar1),types,0x800);
  return;
}

Assistant:

BatchCollectionChunkScanState::BatchCollectionChunkScanState(BatchedDataCollection &collection,
                                                             BatchedChunkIteratorRange &range, ClientContext &context)
    : ChunkScanState(), collection(collection) {
	collection.InitializeScan(state, range);
	current_chunk = make_uniq<DataChunk>();
	auto &allocator = BufferManager::GetBufferManager(context).GetBufferAllocator();
	current_chunk->Initialize(allocator, collection.Types());
}